

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O2

int __thiscall ModbusAnalyzer::ASCII2INT(ModbusAnalyzer *this,char value)

{
  int iVar1;
  
  iVar1 = 0;
  if ((byte)(value - 0x31U) < 0x16) {
    iVar1 = (&DAT_001190ec)[(byte)(value - 0x31U)];
  }
  return iVar1;
}

Assistant:

int ModbusAnalyzer::ASCII2INT( char value )
{
    switch( value )
    {
    case '0':
        return 0;
        break;
    case '1':
        return 1;
        break;
    case '2':
        return 2;
        break;
    case '3':
        return 3;
        break;
    case '4':
        return 4;
        break;
    case '5':
        return 5;
        break;
    case '6':
        return 6;
        break;
    case '7':
        return 7;
        break;
    case '8':
        return 8;
        break;
    case '9':
        return 9;
        break;
    case 'A':
        return 0xA;
        break;
    case 'B':
        return 0xB;
        break;
    case 'C':
        return 0xC;
        break;
    case 'D':
        return 0xD;
        break;
    case 'E':
        return 0xE;
        break;
    case 'F':
        return 0xF;
        break;
    default:
        return 0;
    }
}